

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RNEMDParameters.cpp
# Opt level: O0

void __thiscall OpenMD::RNEMD::RNEMDParameters::RNEMDParameters(RNEMDParameters *this)

{
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>
  __s;
  undefined1 uVar1;
  undefined8 *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>,_bool>
  pVar2;
  string *in_stack_ffffffffffffe878;
  undefined7 in_stack_ffffffffffffe880;
  undefined1 in_stack_ffffffffffffe887;
  value_type *in_stack_ffffffffffffe888;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *in_stack_ffffffffffffe890;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  *this_00;
  undefined7 in_stack_ffffffffffffe8b0;
  undefined1 in_stack_ffffffffffffe8b7;
  char *in_stack_ffffffffffffe8b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffe8c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  allocator<char> local_10d1;
  string local_10d0 [78];
  bool local_1082;
  allocator<char> local_1081;
  string local_1080 [32];
  _Base_ptr local_1060;
  undefined1 local_1058;
  undefined8 *local_1050;
  allocator<char> local_1041;
  string local_1040 [72];
  int local_ff8;
  allocator<char> local_ff1;
  string local_ff0 [32];
  _Base_ptr local_fd0;
  undefined1 local_fc8;
  undefined8 *local_fc0;
  allocator<char> local_fb1;
  string local_fb0 [79];
  allocator<char> local_f61;
  string local_f60 [39];
  allocator<char> local_f39;
  string local_f38 [32];
  _Base_ptr local_f18;
  undefined1 local_f10;
  undefined8 *local_f08;
  allocator<char> local_ef9;
  string local_ef8 [79];
  allocator<char> local_ea9;
  string local_ea8 [32];
  _Base_ptr local_e88;
  undefined1 local_e80;
  undefined8 *local_e78;
  allocator<char> local_e69;
  string local_e68 [79];
  allocator<char> local_e19;
  string local_e18 [32];
  _Base_ptr local_df8;
  undefined1 local_df0;
  undefined8 *local_de8;
  allocator<char> local_dd9;
  string local_dd8 [79];
  allocator<char> local_d89;
  string local_d88 [32];
  _Base_ptr local_d68;
  undefined1 local_d60;
  undefined8 *local_d58;
  allocator<char> local_d49;
  string local_d48 [72];
  double local_d00;
  allocator<char> local_cf1;
  string local_cf0 [32];
  _Base_ptr local_cd0;
  undefined1 local_cc8;
  undefined8 *local_cc0;
  allocator<char> local_cb1;
  string local_cb0 [72];
  int local_c68;
  allocator<char> local_c61;
  string local_c60 [32];
  _Base_ptr local_c40;
  undefined1 local_c38;
  undefined8 *local_c30;
  allocator<char> local_c21;
  string local_c20 [79];
  allocator<char> local_bd1;
  string local_bd0 [32];
  _Base_ptr local_bb0;
  undefined1 local_ba8;
  undefined8 *local_ba0;
  allocator<char> local_b91;
  string local_b90 [79];
  allocator<char> local_b41;
  string local_b40 [32];
  _Base_ptr local_b20;
  undefined1 local_b18;
  undefined8 *local_b10;
  allocator<char> local_b01;
  string local_b00 [79];
  allocator<char> local_ab1;
  string local_ab0 [32];
  _Base_ptr local_a90;
  undefined1 local_a88;
  undefined8 *local_a80;
  allocator<char> local_a71;
  string local_a70 [79];
  allocator<char> local_a21;
  string local_a20 [32];
  _Base_ptr local_a00;
  undefined1 local_9f8;
  undefined8 *local_9f0;
  allocator<char> local_9e1;
  string local_9e0 [79];
  allocator<char> local_991;
  string local_990 [32];
  _Base_ptr local_970;
  undefined1 local_968;
  undefined8 *local_960;
  allocator<char> local_951;
  string local_950 [79];
  allocator<char> local_901;
  string local_900 [32];
  _Base_ptr local_8e0;
  undefined1 local_8d8;
  undefined8 *local_8d0;
  allocator<char> local_8c1;
  string local_8c0 [79];
  allocator<char> local_871;
  string local_870 [32];
  _Base_ptr local_850;
  undefined1 local_848;
  undefined8 *local_840;
  allocator<char> local_831;
  string local_830 [79];
  allocator<char> local_7e1;
  string local_7e0 [32];
  _Base_ptr local_7c0;
  undefined1 local_7b8;
  undefined8 *local_7b0;
  allocator<char> local_7a1;
  string local_7a0 [79];
  allocator<char> local_751;
  string local_750 [32];
  _Base_ptr local_730;
  undefined1 local_728;
  undefined8 *local_720;
  allocator<char> local_711;
  string local_710 [79];
  allocator<char> local_6c1;
  string local_6c0 [32];
  _Base_ptr local_6a0;
  undefined1 local_698;
  undefined8 *local_690;
  allocator<char> local_681;
  string local_680 [79];
  allocator<char> local_631;
  string local_630 [32];
  _Base_ptr local_610;
  undefined1 local_608;
  undefined8 *local_600;
  allocator<char> local_5f1;
  string local_5f0 [79];
  allocator<char> local_5a1;
  string local_5a0 [32];
  _Base_ptr local_580;
  undefined1 local_578;
  undefined8 *local_570;
  allocator<char> local_561;
  string local_560 [79];
  allocator<char> local_511;
  string local_510 [32];
  _Base_ptr local_4f0;
  undefined1 local_4e8;
  undefined8 *local_4e0;
  allocator<char> local_4d1;
  string local_4d0 [79];
  allocator<char> local_481;
  string local_480 [32];
  _Base_ptr local_460;
  undefined1 local_458;
  undefined8 *local_450;
  allocator<char> local_441;
  string local_440 [79];
  allocator<char> local_3f1;
  string local_3f0 [32];
  _Base_ptr local_3d0;
  undefined1 local_3c8;
  undefined8 *local_3c0;
  allocator<char> local_3b1;
  string local_3b0 [79];
  allocator<char> local_361;
  string local_360 [32];
  _Base_ptr local_340;
  undefined1 local_338;
  undefined8 *local_330;
  allocator<char> local_321;
  string local_320 [72];
  double local_2d8;
  allocator<char> local_2c9;
  string local_2c8 [32];
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  undefined8 *local_298;
  allocator<char> local_289;
  string local_288 [79];
  allocator<char> local_239;
  string local_238 [32];
  _Base_ptr local_218;
  undefined1 local_210;
  undefined8 *local_208;
  allocator<char> local_1f9;
  string local_1f8 [79];
  allocator<char> local_1a9;
  string local_1a8 [39];
  allocator<char> local_181;
  string local_180 [32];
  _Base_ptr local_160;
  undefined1 local_158;
  undefined8 *local_150;
  allocator<char> local_141;
  string local_140 [79];
  allocator<char> local_f1;
  string local_f0 [39];
  allocator<char> local_c9;
  string local_c8 [32];
  _Base_ptr local_a8;
  undefined1 local_a0;
  undefined8 *local_98;
  allocator<char> local_89;
  string local_88 [78];
  bool local_3a;
  allocator<char> local_39;
  string local_38 [56];
  
  DataHolder::DataHolder
            ((DataHolder *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  *in_RDI = &PTR__RNEMDParameters_005019f8;
  Parameter<bool>::Parameter
            ((Parameter<bool> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)
             CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)
             CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::vector<double,_std::allocator<double>_>_>::Parameter
            ((Parameter<std::vector<double,_std::allocator<double>_>_> *)
             CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<int>::Parameter
            ((Parameter<int> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<double>::Parameter
            ((Parameter<double> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  Parameter((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<int>::Parameter
            ((Parameter<int> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  Parameter<bool>::Parameter
            ((Parameter<bool> *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  *(undefined1 *)(in_RDI + 0xf5) = 0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator(&local_39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xd),true);
  local_3a = false;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0xd),&local_3a);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_98 = in_RDI + 0xd;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_a8 = (_Base_ptr)pVar2.first._M_node;
  local_a0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x369326);
  std::__cxx11::string::~string(local_88);
  std::allocator<char>::~allocator(&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_c8);
  std::allocator<char>::~allocator(&local_c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x13),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
                  in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_f0);
  std::allocator<char>::~allocator(&local_f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_150 = in_RDI + 0x13;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_160 = (_Base_ptr)pVar2.first._M_node;
  local_158 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36951c);
  std::__cxx11::string::~string(local_140);
  std::allocator<char>::~allocator(&local_141);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_180);
  std::allocator<char>::~allocator(&local_181);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x27),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
                  in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_1a8);
  std::allocator<char>::~allocator(&local_1a9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_208 = in_RDI + 0x27;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_218 = (_Base_ptr)pVar2.first._M_node;
  local_210 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x369712);
  std::__cxx11::string::~string(local_1f8);
  std::allocator<char>::~allocator(&local_1f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_238);
  std::allocator<char>::~allocator(&local_239);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x31),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_298 = in_RDI + 0x31;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_2a8 = (_Base_ptr)pVar2.first._M_node;
  local_2a0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36988e);
  std::__cxx11::string::~string(local_288);
  std::allocator<char>::~allocator(&local_289);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_2c8);
  std::allocator<char>::~allocator(&local_2c9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x3b),true);
  local_2d8 = 100.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0x3b),&local_2d8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_330 = in_RDI + 0x3b;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_340 = (_Base_ptr)pVar2.first._M_node;
  local_338 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x369a3a);
  std::__cxx11::string::~string(local_320);
  std::allocator<char>::~allocator(&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_360);
  std::allocator<char>::~allocator(&local_361);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x42),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_3c0 = in_RDI + 0x42;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_3d0 = (_Base_ptr)pVar2.first._M_node;
  local_3c8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x369bb6);
  std::__cxx11::string::~string(local_3b0);
  std::allocator<char>::~allocator(&local_3b1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_3f0);
  std::allocator<char>::~allocator(&local_3f1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x49),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_450 = in_RDI + 0x49;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_460 = (_Base_ptr)pVar2.first._M_node;
  local_458 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x369d32);
  std::__cxx11::string::~string(local_440);
  std::allocator<char>::~allocator(&local_441);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_480);
  std::allocator<char>::~allocator(&local_481);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x50),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_4e0 = in_RDI + 0x50;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_4f0 = (_Base_ptr)pVar2.first._M_node;
  local_4e8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x369eae);
  std::__cxx11::string::~string(local_4d0);
  std::allocator<char>::~allocator(&local_4d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_510);
  std::allocator<char>::~allocator(&local_511);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x57),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_570 = in_RDI + 0x57;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_580 = (_Base_ptr)pVar2.first._M_node;
  local_578 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36a02a);
  std::__cxx11::string::~string(local_560);
  std::allocator<char>::~allocator(&local_561);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_5a0);
  std::allocator<char>::~allocator(&local_5a1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x5e),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_600 = in_RDI + 0x5e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_610 = (_Base_ptr)pVar2.first._M_node;
  local_608 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36a1a6);
  std::__cxx11::string::~string(local_5f0);
  std::allocator<char>::~allocator(&local_5f1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_630);
  std::allocator<char>::~allocator(&local_631);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x67),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_690 = in_RDI + 0x67;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_6a0 = (_Base_ptr)pVar2.first._M_node;
  local_698 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36a322);
  std::__cxx11::string::~string(local_680);
  std::allocator<char>::~allocator(&local_681);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_6c0);
  std::allocator<char>::~allocator(&local_6c1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x6e),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_720 = in_RDI + 0x6e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_730 = (_Base_ptr)pVar2.first._M_node;
  local_728 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36a49e);
  std::__cxx11::string::~string(local_710);
  std::allocator<char>::~allocator(&local_711);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_750);
  std::allocator<char>::~allocator(&local_751);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x77),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_7b0 = in_RDI + 0x77;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_7c0 = (_Base_ptr)pVar2.first._M_node;
  local_7b8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36a61a);
  std::__cxx11::string::~string(local_7a0);
  std::allocator<char>::~allocator(&local_7a1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_7e0);
  std::allocator<char>::~allocator(&local_7e1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x7e),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_840 = in_RDI + 0x7e;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_850 = (_Base_ptr)pVar2.first._M_node;
  local_848 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36a796);
  std::__cxx11::string::~string(local_830);
  std::allocator<char>::~allocator(&local_831);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_870);
  std::allocator<char>::~allocator(&local_871);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x85),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_8d0 = in_RDI + 0x85;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_8e0 = (_Base_ptr)pVar2.first._M_node;
  local_8d8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36a912);
  std::__cxx11::string::~string(local_8c0);
  std::allocator<char>::~allocator(&local_8c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_900);
  std::allocator<char>::~allocator(&local_901);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x8c),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_960 = in_RDI + 0x8c;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_970 = (_Base_ptr)pVar2.first._M_node;
  local_968 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36aa8e);
  std::__cxx11::string::~string(local_950);
  std::allocator<char>::~allocator(&local_951);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_990);
  std::allocator<char>::~allocator(&local_991);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x93),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_9f0 = in_RDI + 0x93;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_a00 = (_Base_ptr)pVar2.first._M_node;
  local_9f8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36ac0a);
  std::__cxx11::string::~string(local_9e0);
  std::allocator<char>::~allocator(&local_9e1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_a20);
  std::allocator<char>::~allocator(&local_a21);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x9a),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_a80 = in_RDI + 0x9a;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_a90 = (_Base_ptr)pVar2.first._M_node;
  local_a88 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36ad86);
  std::__cxx11::string::~string(local_a70);
  std::allocator<char>::~allocator(&local_a71);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_ab0);
  std::allocator<char>::~allocator(&local_ab1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xa4),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_b10 = in_RDI + 0xa4;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_b20 = (_Base_ptr)pVar2.first._M_node;
  local_b18 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36af02);
  std::__cxx11::string::~string(local_b00);
  std::allocator<char>::~allocator(&local_b01);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_b40);
  std::allocator<char>::~allocator(&local_b41);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xb5),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_ba0 = in_RDI + 0xb5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_bb0 = (_Base_ptr)pVar2.first._M_node;
  local_ba8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36b07e);
  std::__cxx11::string::~string(local_b90);
  std::allocator<char>::~allocator(&local_b91);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_bd0);
  std::allocator<char>::~allocator(&local_bd1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xbe),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_c30 = in_RDI + 0xbe;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_c40 = (_Base_ptr)pVar2.first._M_node;
  local_c38 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36b1fa);
  std::__cxx11::string::~string(local_c20);
  std::allocator<char>::~allocator(&local_c21);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_c60);
  std::allocator<char>::~allocator(&local_c61);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 200),true);
  local_c68 = 0x14;
  Parameter<int>::setDefaultValue((Parameter<int> *)(in_RDI + 200),&local_c68);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_cc0 = in_RDI + 200;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_cd0 = (_Base_ptr)pVar2.first._M_node;
  local_cc8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36b39f);
  std::__cxx11::string::~string(local_cb0);
  std::allocator<char>::~allocator(&local_cb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_cf0);
  std::allocator<char>::~allocator(&local_cf1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xce),true);
  local_d00 = 2.0;
  Parameter<double>::setDefaultValue((Parameter<double> *)(in_RDI + 0xce),&local_d00);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_d58 = in_RDI + 0xce;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_d68 = (_Base_ptr)pVar2.first._M_node;
  local_d60 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36b54b);
  std::__cxx11::string::~string(local_d48);
  std::allocator<char>::~allocator(&local_d49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_d88);
  std::allocator<char>::~allocator(&local_d89);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0x1d),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_de8 = in_RDI + 0x1d;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_df8 = (_Base_ptr)pVar2.first._M_node;
  local_df0 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36b6c7);
  std::__cxx11::string::~string(local_dd8);
  std::allocator<char>::~allocator(&local_dd9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_e18);
  std::allocator<char>::~allocator(&local_e19);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xd5),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_e78 = in_RDI + 0xd5;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_e88 = (_Base_ptr)pVar2.first._M_node;
  local_e80 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36b843);
  std::__cxx11::string::~string(local_e68);
  std::allocator<char>::~allocator(&local_e69);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_ea8);
  std::allocator<char>::~allocator(&local_ea9);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xae),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_f08 = in_RDI + 0xae;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_f18 = (_Base_ptr)pVar2.first._M_node;
  local_f10 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36b9bf);
  std::__cxx11::string::~string(local_ef8);
  std::allocator<char>::~allocator(&local_ef9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_f38);
  std::allocator<char>::~allocator(&local_f39);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xdf),true);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  setDefaultValue((Parameter<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
                  in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_f60);
  std::allocator<char>::~allocator(&local_f61);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_fc0 = in_RDI + 0xdf;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  local_fd0 = (_Base_ptr)pVar2.first._M_node;
  local_fc8 = pVar2.second;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36bba3);
  std::__cxx11::string::~string(local_fb0);
  std::allocator<char>::~allocator(&local_fb1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffe8c0,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_ff0);
  std::allocator<char>::~allocator(&local_ff1);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xe9),true);
  local_ff8 = 3;
  Parameter<int>::setDefaultValue((Parameter<int> *)(in_RDI + 0xe9),&local_ff8);
  this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,in_stack_ffffffffffffe8b8,
             (allocator<char> *)CONCAT17(in_stack_ffffffffffffe8b7,in_stack_ffffffffffffe8b0));
  local_1050 = in_RDI + 0xe9;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (in_stack_ffffffffffffe890,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  pVar2 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
                    *)in_stack_ffffffffffffe890,in_stack_ffffffffffffe888);
  __s = pVar2.first._M_node;
  uVar1 = pVar2.second;
  local_1060 = __s._M_node;
  local_1058 = uVar1;
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36bd24);
  std::__cxx11::string::~string(local_1040);
  std::allocator<char>::~allocator(&local_1041);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s._M_node,
             (allocator<char> *)CONCAT17(uVar1,in_stack_ffffffffffffe8b0));
  ParameterBase::setKeyword
            ((ParameterBase *)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880),
             in_stack_ffffffffffffe878);
  std::__cxx11::string::~string(local_1080);
  std::allocator<char>::~allocator(&local_1081);
  ParameterBase::setOptional((ParameterBase *)(in_RDI + 0xef),true);
  local_1082 = false;
  Parameter<bool>::setDefaultValue((Parameter<bool> *)(in_RDI + 0xef),&local_1082);
  this_00 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
             *)(in_RDI + 1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_01,(char *)__s._M_node,
             (allocator<char> *)CONCAT17(uVar1,in_stack_ffffffffffffe8b0));
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_true>
            (this_00,&in_stack_ffffffffffffe888->first,
             (ParameterBase **)CONCAT17(in_stack_ffffffffffffe887,in_stack_ffffffffffffe880));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
  ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>_>_>
            *)this_00,in_stack_ffffffffffffe888);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ParameterBase_*>
           *)0x36bea2);
  std::__cxx11::string::~string(local_10d0);
  std::allocator<char>::~allocator(&local_10d1);
  return;
}

Assistant:

RNEMDParameters::RNEMDParameters() {
    DefineOptionalParameterWithDefaultValue(UseRNEMD, "useRNEMD", false);
    DefineOptionalParameterWithDefaultValue(ObjectSelection, "objectSelection",
                                            "select all");

    DefineOptionalParameterWithDefaultValue(Method, "method", "VSS");
    DefineOptionalParameter(FluxType, "fluxType");

    DefineOptionalParameterWithDefaultValue(ExchangeTime, "exchangeTime",
                                            100.0);
    DefineOptionalParameter(KineticFlux, "kineticFlux");
    DefineOptionalParameter(ParticleFlux, "particleFlux");
    DefineOptionalParameter(CurrentDensity, "currentDensity");
    DefineOptionalParameter(MomentumFlux, "momentumFlux");
    DefineOptionalParameter(MomentumFluxVector, "momentumFluxVector");
    DefineOptionalParameter(AngularMomentumFlux, "angularMomentumFlux");
    DefineOptionalParameter(AngularMomentumFluxVector,
                            "angularMomentumFluxVector");
    DefineOptionalParameter(SlabWidth, "slabWidth");
    DefineOptionalParameter(SlabACenter, "slabAcenter");
    DefineOptionalParameter(SlabBCenter, "slabBcenter");
    DefineOptionalParameter(SphereARadius, "sphereAradius");
    DefineOptionalParameter(SphereBRadius, "sphereBradius");
    DefineOptionalParameter(SelectionA, "selectionA");
    DefineOptionalParameter(SelectionB, "selectionB");
    DefineOptionalParameter(CoordinateOrigin, "coordinateOrigin");
    DefineOptionalParameter(OutputFileName, "outputFileName");
    DefineOptionalParameterWithDefaultValue(OutputBins, "outputBins", 20);
    DefineOptionalParameterWithDefaultValue(OutputBinWidth, "outputBinWidth",
                                            2.0);
    DefineOptionalParameter(OutputSelection, "outputSelection");
    DefineOptionalParameter(OutputFields, "outputFields");
    DefineOptionalParameter(DividingArea, "dividingArea");
    DefineOptionalParameterWithDefaultValue(PrivilegedAxis, "privilegedAxis",
                                            "z");
    DefineOptionalParameterWithDefaultValue(SPFScalingPower, "spfScalingPower",
                                            3);
    DefineOptionalParameterWithDefaultValue(SPFUniformKineticScaling,
                                            "spfUniformKineticScaling", false);
  }